

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckTypedefs.cxx
# Opt level: O3

string * __thiscall
kws::Parser::FindTypedef_abi_cxx11_
          (string *__return_storage_ptr__,Parser *this,size_t start,size_t end,size_t *pos,
          size_t *beg,size_t *typdefpos)

{
  pointer pcVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  string *psVar5;
  ulong uVar6;
  string sub;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  ulong *local_60;
  size_t local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  psVar5 = &this->m_BufferNoComment;
  uVar3 = std::__cxx11::string::find((char *)psVar5,0x1763fb,start);
  if (uVar3 == 0xffffffffffffffff) {
    *pos = 0xffffffffffffffff;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    *typdefpos = uVar3;
    local_60 = beg;
    local_58 = end;
    uVar3 = std::__cxx11::string::find((char *)psVar5,0x175d46,uVar3);
    std::__cxx11::string::substr((ulong)local_50,(ulong)psVar5);
    lVar4 = std::__cxx11::string::find((char *)local_50,0x175d52,0);
    if ((((lVar4 == -1) &&
         (lVar4 = std::__cxx11::string::find((char *)local_50,0x1689d1,0), lVar4 == -1)) &&
        (lVar4 = std::__cxx11::string::find((char *)local_50,0x168cee,0), lVar4 == -1)) &&
       (lVar4 = std::__cxx11::string::find((char *)local_50,0x16d6f2,0), lVar4 == -1)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      if (uVar3 < local_58) {
        bVar2 = true;
        uVar6 = uVar3;
        do {
          while (uVar6 = uVar6 - 1, (psVar5->_M_dataplus)._M_p[uVar6] == ' ') {
            if (!bVar2) goto LAB_0014cf6e;
          }
          local_80[0] = local_70;
          pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_80,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
          std::__cxx11::string::_M_replace_aux
                    ((ulong)__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,'\x01'
                    );
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80[0]);
          *local_60 = uVar6;
          if (local_80[0] != local_70) {
            operator_delete(local_80[0]);
          }
          bVar2 = false;
        } while( true );
      }
LAB_0014cf6e:
      *pos = uVar3;
    }
    else {
      *pos = uVar3;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::FindTypedef(size_t start, size_t end,size_t & pos,size_t & beg,size_t & typdefpos)
{
  size_t posTypedef  = m_BufferNoComment.find("typedef",start);
  if(posTypedef == std::string::npos)
    {
    pos = std::string::npos;
    return "";
    }

  typdefpos = posTypedef;
  size_t posSemicolon = m_BufferNoComment.find(";",posTypedef);

  // Check if we have any () in the subword then we don't check the typdef
  std::string sub = m_BufferNoComment.substr(posTypedef,posSemicolon-posTypedef);
  if((sub.find("(",0) != std::string::npos)
    || (sub.find(")",0) != std::string::npos)
    || (sub.find("{",0) != std::string::npos)
    || (sub.find("}",0) != std::string::npos)
    )
    {
    pos = posSemicolon;
    return "";
    }

  std::string typedefname = "";
  if(posSemicolon != std::string::npos && posSemicolon<end)
    {
    // We try to find the word before that
    size_t i=posSemicolon-1;
    bool inWord = true;
    bool first = false;
    while(inWord)
      {
      if(m_BufferNoComment[i] != ' ')
        {
        std::string store = typedefname;
        typedefname = m_BufferNoComment[i];
        typedefname += store;
        beg = i;
        inWord = true;
        first = true;
        }
      else // we have a space
        {
        if(first)
          {
          inWord = false;
          }
        }
      i--;
      }
    }

  pos = posSemicolon;
  return typedefname;
}